

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommandlineparser.cpp
# Opt level: O1

QStringList * __thiscall
QCommandLineParserPrivate::aliases
          (QStringList *__return_storage_ptr__,QCommandLineParserPrivate *this,QString *optionName)

{
  Span *pSVar1;
  ulong uVar2;
  const_iterator cVar3;
  
  cVar3 = QHash<QString,_long_long>::constFindImpl<QString>(&this->nameHash,optionName);
  if (cVar3.i.d == (Data<QHashPrivate::Node<QString,_long_long>_> *)0x0 && cVar3.i.bucket == 0) {
    aliases();
  }
  else {
    pSVar1 = (cVar3.i.d)->spans;
    uVar2 = cVar3.i.bucket >> 7;
    QCommandLineOption::names
              (__return_storage_ptr__,
               (this->commandLineOptionList).d.ptr +
               *(long *)(pSVar1[uVar2].entries[pSVar1[uVar2].offsets[(uint)cVar3.i.bucket & 0x7f]].
                         storage.data + 0x18));
  }
  return __return_storage_ptr__;
}

Assistant:

QStringList QCommandLineParserPrivate::aliases(const QString &optionName) const
{
    const NameHash_t::const_iterator it = nameHash.constFind(optionName);
    if (it == nameHash.cend()) {
        qWarning("QCommandLineParser: option not defined: \"%ls\"", qUtf16Printable(optionName));
        return QStringList();
    }
    return commandLineOptionList.at(*it).names();
}